

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

void tinygltf::SerializeGltfImage(Image *image,string *uri,json *o)

{
  string *psVar1;
  string *local_40 [4];
  
  if (uri->_M_string_length == 0) {
    psVar1 = (string *)(local_40 + 2);
    local_40[0] = psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"mimeType","");
    SerializeStringProperty(local_40[0],(string *)(image->mimeType)._M_dataplus._M_p,o);
    if (local_40[0] != psVar1) {
      operator_delete(local_40[0]);
    }
    local_40[0] = psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"bufferView","");
    SerializeNumberProperty<int>(local_40[0],image->bufferView,o);
    if (local_40[0] == psVar1) goto LAB_001253d2;
  }
  else {
    local_40[0] = (string *)(local_40 + 2);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"uri","");
    SerializeStringProperty(local_40[0],(string *)(uri->_M_dataplus)._M_p,o);
    if (local_40[0] == (string *)(local_40 + 2)) goto LAB_001253d2;
  }
  operator_delete(local_40[0]);
LAB_001253d2:
  if ((image->name)._M_string_length != 0) {
    local_40[0] = (string *)(local_40 + 2);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"name","");
    SerializeStringProperty(local_40[0],(string *)(image->name)._M_dataplus._M_p,o);
    if (local_40[0] != (string *)(local_40 + 2)) {
      operator_delete(local_40[0]);
    }
  }
  SerializeExtensionMap(&image->extensions,o);
  SerializeExtras(&image->extras,o);
  return;
}

Assistant:

static void SerializeGltfImage(const Image &image, const std::string &uri,
                               detail::json &o) {
  // From 2.7.0, we look for `uri` parameter, not `Image.uri`
  // if uri is empty, the mimeType and bufferview should be set
  if (uri.empty()) {
    SerializeStringProperty("mimeType", image.mimeType, o);
    SerializeNumberProperty<int>("bufferView", image.bufferView, o);
  } else {
    SerializeStringProperty("uri", uri, o);
  }

  if (image.name.size()) {
    SerializeStringProperty("name", image.name, o);
  }

  SerializeExtrasAndExtensions(image, o);
}